

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  BuildContext *this_00;
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  Rule *pRVar6;
  pointer pMVar7;
  Rule *pRVar8;
  FileInfo *this_01;
  vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *this_02;
  const_reference ppNVar9;
  Pool *pPVar10;
  Pool *pPVar11;
  anon_class_1_0_00000001 local_341;
  function<void_()> local_340;
  anon_class_24_1_125719a9 local_320;
  function<void_()> local_308;
  undefined1 local_2e1;
  NinjaCommandTask *pNStack_2e0;
  bool isConsolePool;
  type addExecuteJob;
  ValueType local_268;
  BuildValue local_250;
  ValueType local_1f0;
  uint local_1d4;
  ValueType local_1d0;
  uint64_t local_1b8;
  undefined1 local_1b0 [8];
  BuildValue result_1;
  uint local_130;
  uint e;
  uint i;
  bool forceChange;
  undefined1 local_120 [8];
  BuildValue result;
  undefined8 local_b8;
  CommandSignature local_b0;
  CommandSignature commandHash;
  ValueType local_48;
  void *local_30;
  NinjaCommandTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (NinjaCommandTask *)ti.impl;
  local_30 = this;
  bVar2 = std::atomic::operator_cast_to_bool((atomic *)(*(long *)((long)this + 8) + 0xa8));
  if (bVar2) {
    anon_unknown.dwarf_83ee8::BuildValue::makeSkippedCommand();
    anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_48,(BuildValue *)&commandHash);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_48,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
    anon_unknown.dwarf_83ee8::BuildValue::~BuildValue((BuildValue *)&commandHash);
  }
  else {
    ti_local.ctx = llbuild::ninja::Command::getCommandString_abi_cxx11_
                             (*(Command **)((long)this + 0x10));
    uVar4 = std::__cxx11::string::data();
    result.commandHash.value = uVar4;
    uVar5 = std::__cxx11::string::length();
    local_b8 = uVar5;
    llbuild::basic::CommandSignature::CommandSignature(&local_b0,stack0xffffffffffffff40);
    pRVar6 = llbuild::ninja::Command::getRule(*(Command **)((long)this + 0x10));
    pMVar7 = std::
             unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>::
             operator->((unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                         *)(*(long *)((long)this + 8) + 0x60));
    pRVar8 = llbuild::ninja::Manifest::getPhonyRule(pMVar7);
    if (pRVar6 == pRVar8) {
      computeCommandResult(llbuild::basic::CommandSignature__const
                ((BuildValue *)local_120,this,local_b0);
      e._3_1_ = false;
      local_130 = 0;
      uVar3 = anon_unknown.dwarf_83ee8::BuildValue::getNumOutputs((BuildValue *)local_120);
      for (; local_130 != uVar3; local_130 = local_130 + 1) {
        this_01 = anon_unknown.dwarf_83ee8::BuildValue::getNthOutputInfo
                            ((BuildValue *)local_120,local_130);
        bVar2 = llbuild::basic::FileInfo::isMissing(this_01);
        if (bVar2) {
          e._3_1_ = true;
          break;
        }
      }
      anon_unknown.dwarf_83ee8::BuildValue::toValue
                ((ValueType *)&result_1.commandHash,(BuildValue *)local_120);
      llbuild::core::TaskInterface::complete
                ((TaskInterface *)&this_local,(ValueType *)&result_1.commandHash,e._3_1_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result_1.commandHash);
      anon_unknown.dwarf_83ee8::BuildValue::~BuildValue((BuildValue *)local_120);
    }
    else {
      if ((*(byte *)((long)this + 0x1a) & 1) != 0) {
        bVar2 = llbuild::ninja::Command::hasGeneratorFlag(*(Command **)((long)this + 0x10));
        if ((!bVar2) &&
           (((*(byte *)((long)this + 0x1b) & 1) == 0 ||
            (bVar2 = llbuild::basic::CommandSignature::operator!=
                               ((CommandSignature *)((long)this + 0x20),&local_b0), bVar2)))) {
          *(undefined1 *)((long)this + 0x1a) = 0;
        }
        if ((*(byte *)((long)this + 0x1a) & 1) != 0) {
          local_1b8 = local_b0.value;
          computeCommandResult(llbuild::basic::CommandSignature__const
                    ((BuildValue *)local_1b0,this,local_b0);
          bVar2 = canUpdateIfNewerWithResult((anonymous)::BuildValue_const__
                            (this,(BuildValue *)local_1b0);
          if (bVar2) {
            std::__atomic_base<unsigned_int>::operator++
                      ((__atomic_base<unsigned_int> *)(*(long *)((long)this + 8) + 200));
            anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_1d0,(BuildValue *)local_1b0);
            llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_1d0,false);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1d0);
          }
          local_1d4 = (uint)bVar2;
          anon_unknown.dwarf_83ee8::BuildValue::~BuildValue((BuildValue *)local_1b0);
          if (local_1d4 != 0) {
            return;
          }
        }
      }
      *(int *)(*(long *)((long)this + 8) + 0xb0) = *(int *)(*(long *)((long)this + 8) + 0xb0) + 1;
      if ((*(byte *)(*(long *)((long)this + 8) + 0x91) & 1) == 0) {
        if ((*(byte *)((long)this + 0x18) & 1) == 0) {
          if (((*(byte *)((long)this + 0x19) ^ 0xff) & 1) == 0) {
            __assert_fail("!hasMissingInput",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                          ,0x4ba,
                          "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::inputsAvailable(core::TaskInterface)"
                         );
          }
          addExecuteJob.this = this_local;
          addExecuteJob.ti.impl = ti_local.impl;
          pNStack_2e0 = (NinjaCommandTask *)this;
          pPVar10 = llbuild::ninja::Command::getExecutionPool(*(Command **)((long)this + 0x10));
          pMVar7 = std::
                   unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                   ::operator->((unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                 *)(*(long *)((long)this + 8) + 0x60));
          pPVar11 = llbuild::ninja::Manifest::getConsolePool(pMVar7);
          local_2e1 = pPVar10 == pPVar11;
          if ((bool)local_2e1) {
            lVar1 = *(long *)((long)this + 8);
            local_320.addExecuteJob.this = pNStack_2e0;
            local_320.addExecuteJob.ti.impl = addExecuteJob.this;
            local_320.addExecuteJob.ti.ctx = addExecuteJob.ti.impl;
            std::function<void()>::
            function<(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface)::_lambda()_1_,void>
                      ((function<void()> *)&local_308,&local_320);
            llbuild::basic::SerialQueue::async((SerialQueue *)(lVar1 + 0xd8),&local_308);
            std::function<void_()>::~function(&local_308);
          }
          else {
            std::function<void()>::
            function<(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface)::_lambda()_2_,void>
                      ((function<void()> *)&local_340,&local_341);
            std::
            remove_reference<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1212:28)_&>
            ::type::operator()(&stack0xfffffffffffffd20,&local_340);
            std::function<void_()>::~function(&local_340);
          }
        }
        else {
          if ((*(byte *)((long)this + 0x19) & 1) != 0) {
            this_00 = *(BuildContext **)((long)this + 8);
            this_02 = llbuild::ninja::Command::getOutputs(*(Command **)((long)this + 0x10));
            ppNVar9 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
                      operator[](this_02,0);
            llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar9);
            uVar5 = std::__cxx11::string::c_str();
            anon_unknown.dwarf_83ee8::BuildContext::emitError
                      (this_00,"cannot build \'%s\' due to missing input",uVar5);
            anon_unknown.dwarf_83ee8::BuildContext::incrementFailedCommands
                      (*(BuildContext **)((long)this + 8));
          }
          anon_unknown.dwarf_83ee8::BuildValue::makeSkippedCommand();
          anon_unknown.dwarf_83ee8::BuildValue::toValue
                    (&local_268,(BuildValue *)&addExecuteJob.ti.ctx);
          llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_268,false);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_268);
          anon_unknown.dwarf_83ee8::BuildValue::~BuildValue((BuildValue *)&addExecuteJob.ti.ctx);
        }
      }
      else {
        if ((*(byte *)(*(long *)((long)this + 8) + 0x90) & 1) == 0) {
          writeDescription((anonymous_namespace)::BuildContext&,llbuild::ninja::Command__
                    (*(BuildContext **)((long)this + 8),*(Command **)((long)this + 0x10));
        }
        anon_unknown.dwarf_83ee8::BuildValue::makeSkippedCommand();
        anon_unknown.dwarf_83ee8::BuildValue::toValue(&local_1f0,&local_250);
        llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_1f0,false);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1f0);
        anon_unknown.dwarf_83ee8::BuildValue::~BuildValue(&local_250);
      }
    }
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // If the build is cancelled, skip everything.
      if (context.isCancelled) {
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // Ignore phony commands.
      //
      // FIXME: Is it right to bring this up-to-date when one of the inputs
      // indicated a failure? It probably doesn't matter.
      auto commandHash = CommandSignature(command->getCommandString());
      if (command->getRule() == context.manifest->getPhonyRule()) {
        // Get the result.
        BuildValue result = computeCommandResult(commandHash);

        // If any output is missing, then we always want to force the change to
        // propagate.
        bool forceChange = false;
        for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
            if (result.getNthOutputInfo(i).isMissing()) {
                forceChange = true;
                break;
            }
        }

        return ti.complete(result.toValue(), forceChange);
      }

      // If it is legal to simply update the command, then if the command output
      // exists and is newer than all of the inputs, don't actually run the
      // command (just bring it up-to-date).
      if (canUpdateIfNewer) {
        // If this isn't a generator command and its command hash differs, we
        // can't update it.
        if (!command->hasGeneratorFlag() &&
            (!hasPriorResult || priorCommandHash != commandHash))
          canUpdateIfNewer = false;

        if (canUpdateIfNewer) {
          BuildValue result = computeCommandResult(commandHash);

          if (canUpdateIfNewerWithResult(result)) {
            // Update the count of the number of commands which have been
            // updated without being rerun.
            ++context.numCommandsUpdated;

            return ti.complete(result.toValue());
          }
        }
      }

      // Otherwise, actually run the command.

      ++context.numBuiltCommands;

      // If we are simulating the build, just print the description and
      // complete.
      if (context.simulate) {
        if (!context.quiet)
          writeDescription(context, command);
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // If not simulating, but this command should be skipped, then do nothing.
      if (shouldSkip) {
        // If this command had a failed input, treat it as having failed.
        if (hasMissingInput) {
          context.emitError("cannot build '%s' due to missing input",
                            command->getOutputs()[0]->getScreenPath().c_str());

          // Update the count of failed commands.
          context.incrementFailedCommands();
        }

        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }
      assert(!hasMissingInput);

      auto addExecuteJob = [this, ti](std::function<void(void)>&& jobFullyExecuted) mutable {
        // Otherwise, enqueue the job to run later.
        ti.spawn({command, [this, ti, done=std::move(jobFullyExecuted)] (QueueJobContext* qctx) mutable {
          // Suppress static analyzer false positive on generalized lambda capture
          // (rdar://problem/22165130).
#ifndef __clang_analyzer__
          // Take care to not rely on the ``this`` object, which may disappear
          // before the queue executes this block.
          BuildContext& localContext(context);
          ninja::Command* localCommand(command);
          auto bucket = qctx->laneID();

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t startTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"B\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(startTime));
              });
          }

          executeCommand(ti, qctx);

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t endTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"E\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(endTime));
              });
          }
          done();
#endif
        }});
      };

      bool isConsolePool = command->getExecutionPool() == context.manifest->getConsolePool();
      if (isConsolePool) {
        context.consoleQueue.async([addExecuteJob=std::move(addExecuteJob)] () mutable {
          std::promise<void> p;
          auto result = p.get_future();
          addExecuteJob([&p]{ p.set_value(); });
          result.get();
        });
      } else {
        addExecuteJob([]{});
      }
    }